

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

QNetworkRequest __thiscall
QNetworkAccessManagerPrivate::prepareMultipart
          (QNetworkAccessManagerPrivate *this,QNetworkRequest *request,QHttpMultiPart *multiPart)

{
  QAnyStringView value;
  QAnyStringView value_00;
  bool bVar1;
  QHttpMultiPartPrivate *pQVar2;
  ulong uVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDI;
  long in_FS_OFFSET;
  QIODevice *device;
  QNetworkRequest *newRequest;
  QByteArray contentType;
  QHttpHeaders h;
  QStringBuilder<QStringBuilder<const_char_(&)[13],_QByteArray_&>,_char> *in_stack_fffffffffffffec8;
  QHttpMultiPartIODevice *function;
  QStringBuilder<const_char_(&)[13],_QByteArray_&> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  ContentType in_stack_fffffffffffffedc;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  QHttpHeaders *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 uVar4;
  byte bVar5;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  size_t in_stack_ffffffffffffff20;
  char local_c0 [36];
  undefined4 local_9c;
  undefined1 local_59;
  QStringBuilder<const_char_(&)[13],_QByteArray_&> local_58;
  QStringBuilder<const_char_(&)[13],_QByteArray_&> local_48;
  undefined8 local_38;
  undefined8 local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  *(undefined8 *)in_RDI.m_data = 0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  aVar6 = in_RDI;
  QNetworkRequest::QNetworkRequest
            ((QNetworkRequest *)in_stack_fffffffffffffed0,
             (QNetworkRequest *)in_stack_fffffffffffffec8);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  QNetworkRequest::headers
            ((QNetworkRequest *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  bVar1 = QHttpHeaders::contains(in_stack_fffffffffffffef0,this_00._4_4_);
  if (!bVar1) {
    local_48.a = (char (*) [13])0xaaaaaaaaaaaaaaaa;
    local_48.b = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    local_38 = 0xaaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffed0 = &local_48;
    QByteArray::QByteArray((QByteArray *)0x19c1b4);
    pQVar2 = QHttpMultiPart::d_func((QHttpMultiPart *)0x19c1be);
    QByteArray::size(&pQVar2->boundary);
    QByteArray::reserve((QByteArray *)in_RDI.m_data,CONCAT17(uVar4,in_stack_fffffffffffffef8));
    QByteArray::operator+=
              ((QByteArray *)in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    pQVar2 = QHttpMultiPart::d_func((QHttpMultiPart *)0x19c1f9);
    in_stack_fffffffffffffedc = pQVar2->contentType;
    if (in_stack_fffffffffffffedc == RelatedType) {
      QByteArray::operator+=
                ((QByteArray *)in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    }
    else if (in_stack_fffffffffffffedc == FormDataType) {
      QByteArray::operator+=
                ((QByteArray *)in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    }
    else if (in_stack_fffffffffffffedc == AlternativeType) {
      QByteArray::operator+=
                ((QByteArray *)in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    }
    else {
      QByteArray::operator+=
                ((QByteArray *)in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    }
    QHttpMultiPart::d_func((QHttpMultiPart *)0x19c280);
    local_58 = ::operator+((char (*) [13])in_stack_fffffffffffffed0,
                           (QByteArray *)in_stack_fffffffffffffec8);
    local_59 = 0x22;
    ::operator+(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    ::operator+=((QByteArray *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_RDI.m_data,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    value.m_size = in_stack_ffffffffffffff20;
    value.field_0.m_data = aVar6.m_data;
    QHttpHeaders::append((QHttpHeaders *)this_00.m_data,in_RDI._4_4_,value);
    QByteArray::~QByteArray((QByteArray *)0x19c324);
  }
  bVar1 = QHttpHeaders::contains(in_stack_fffffffffffffef0,this_00._4_4_);
  if (!bVar1) {
    Qt::Literals::StringLiterals::operator____ba(this_00.m_data_utf8,(size_t)in_RDI);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_RDI.m_data,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    value_00.m_size = in_stack_ffffffffffffff20;
    value_00.field_0.m_data = aVar6.m_data;
    QHttpHeaders::append((QHttpHeaders *)this_00.m_data,in_RDI._4_4_,value_00);
    QByteArray::~QByteArray((QByteArray *)0x19c397);
  }
  QNetworkRequest::setHeaders
            ((QNetworkRequest *)in_stack_fffffffffffffed0,(QHttpHeaders *)in_stack_fffffffffffffec8)
  ;
  pQVar2 = QHttpMultiPart::d_func((QHttpMultiPart *)0x19c3b3);
  function = pQVar2->device;
  uVar3 = QIODevice::isReadable();
  if ((uVar3 & 1) == 0) {
    uVar3 = QIODevice::isOpen();
    if ((uVar3 & 1) == 0) {
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffed0,
                 (OpenModeFlag)((ulong)function >> 0x20));
      uVar3 = (**(code **)(*(long *)function + 0x68))(function,local_9c);
      if ((uVar3 & 1) == 0) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_RDI.m_data,
                   (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(char *)function);
        QMessageLogger::warning(local_c0,"could not open device for reading");
      }
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI.m_data,
                 (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(char *)in_stack_fffffffffffffec8);
      QMessageLogger::warning(&stack0xffffffffffffff20,"device is not readable");
    }
  }
  bVar5 = 1;
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x19c471);
  if ((bVar5 & 1) == 0) {
    QNetworkRequest::~QNetworkRequest((QNetworkRequest *)in_stack_fffffffffffffed0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QNetworkRequest)in_RDI.m_data;
}

Assistant:

QNetworkRequest QNetworkAccessManagerPrivate::prepareMultipart(const QNetworkRequest &request, QHttpMultiPart *multiPart)
{
    // copy the request, we probably need to add some headers
    QNetworkRequest newRequest(request);
    auto h = newRequest.headers();

    // add Content-Type header if not there already
    if (!h.contains(QHttpHeaders::WellKnownHeader::ContentType)) {
        QByteArray contentType;
        contentType.reserve(34 + multiPart->d_func()->boundary.size());
        contentType += "multipart/";
        switch (multiPart->d_func()->contentType) {
        case QHttpMultiPart::RelatedType:
            contentType += "related";
            break;
        case QHttpMultiPart::FormDataType:
            contentType += "form-data";
            break;
        case QHttpMultiPart::AlternativeType:
            contentType += "alternative";
            break;
        default:
            contentType += "mixed";
            break;
        }
        // putting the boundary into quotes, recommended in RFC 2046 section 5.1.1
        contentType += "; boundary=\"" + multiPart->d_func()->boundary + '"';
        h.append(QHttpHeaders::WellKnownHeader::ContentType, contentType);
    }

    // add MIME-Version header if not there already (we must include the header
    // if the message conforms to RFC 2045, see section 4 of that RFC)
    if (!h.contains(QHttpHeaders::WellKnownHeader::MIMEVersion))
        h.append(QHttpHeaders::WellKnownHeader::MIMEVersion, "1.0"_ba);

    newRequest.setHeaders(std::move(h));

    QIODevice *device = multiPart->d_func()->device;
    if (!device->isReadable()) {
        if (!device->isOpen()) {
            if (!device->open(QIODevice::ReadOnly))
                qWarning("could not open device for reading");
        } else {
            qWarning("device is not readable");
        }
    }

    return newRequest;
}